

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O3

bool __thiscall cfd::core::Script::IsPegoutScript(Script *this)

{
  pointer pSVar1;
  size_t sVar2;
  ScriptElementType *pSVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  ByteData local_28;
  
  sVar2 = ByteData::GetDataSize(&this->script_data_);
  if (((1 < sVar2) &&
      (pSVar1 = (this->script_stack_).
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_start,
      (pSVar1->op_code_).data_type_ == ScriptOperator::OP_RETURN._8_4_)) &&
     (pSVar1[1].type_ == kElementBinary)) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,
               &pSVar1[1].binary_data_.data_);
    sVar2 = ByteData::GetDataSize(&local_28);
    if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (sVar2 == 0x20) {
      pSVar1 = (this->script_stack_).
               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = ((long)(this->script_stack_).
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 5) *
              -0x5555555555555555;
      if (uVar4 < 3) {
        return true;
      }
      lVar5 = uVar4 - 3;
      pSVar3 = &pSVar1[2].type_;
      do {
        bVar6 = lVar5 != 0;
        lVar5 = lVar5 + -1;
        bVar7 = *pSVar3 == kElementBinary;
        if (!bVar7) {
          return bVar7;
        }
        pSVar3 = pSVar3 + 0x18;
      } while (bVar6);
      return bVar7;
    }
  }
  return false;
}

Assistant:

bool Script::IsPegoutScript() const {
  if ((script_data_.GetDataSize() < 2) ||
      (script_stack_[0].GetOpCode() != ScriptOperator::OP_RETURN)) {
    return false;
  }

  if (!script_stack_[1].IsBinary() ||
      script_stack_[1].GetBinaryData().GetDataSize() != kByteData256Length) {
    return false;
  }

  for (size_t i = 2; i < script_stack_.size(); ++i) {
    if (!script_stack_[i].IsBinary()) {
      return false;
    }
  }

  return true;
}